

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O0

ReturnType __thiscall
pbrt::ParameterDictionary::lookupSingle<(pbrt::ParameterType)1>
          (ParameterDictionary *this,string *name,ReturnType defaultValue)

{
  bool bVar1;
  const_iterator ppPVar2;
  vector<double,_pstd::pmr::polymorphic_allocator<double>_> *this_00;
  size_t sVar3;
  const_pointer v;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_RDI;
  ReturnType in_XMM0_Da;
  Float FVar4;
  vector<double,_pstd::pmr::polymorphic_allocator<double>_> *values;
  ParsedParameter *p;
  const_iterator __end2;
  const_iterator __begin2;
  ParsedParameterVector *__range2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_stack_ffffffffffffffc0;
  ParsedParameter *param;
  const_iterator local_30;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  local_30 = InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
             ::begin(in_RDI);
  ppPVar2 = InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
            ::end(in_stack_ffffffffffffffc0);
  while( true ) {
    if (local_30 == ppPVar2) {
      return in_XMM0_Da;
    }
    param = *local_30;
    bVar1 = std::operator!=(&param->type,in_stack_ffffffffffffffb8);
    if ((!bVar1) &&
       (bVar1 = std::operator!=(&param->type,(char *)in_stack_ffffffffffffffb8), !bVar1)) break;
    local_30 = local_30 + 1;
  }
  this_00 = ParameterTypeTraits<(pbrt::ParameterType)1>::GetValues(param);
  bVar1 = pstd::vector<double,_pstd::pmr::polymorphic_allocator<double>_>::empty
                    ((vector<double,_pstd::pmr::polymorphic_allocator<double>_> *)0x437133);
  if (!bVar1) {
    sVar3 = pstd::vector<double,_pstd::pmr::polymorphic_allocator<double>_>::size(this_00);
    if (sVar3 < 2) {
      param->lookedUp = true;
      v = pstd::vector<double,_pstd::pmr::polymorphic_allocator<double>_>::data(this_00);
      FVar4 = ParameterTypeTraits<(pbrt::ParameterType)1>::Convert(v,&param->loc);
      return FVar4;
    }
    ErrorExit<std::__cxx11::string_const&>
              ((FileLoc *)values,
               (char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  }
  ErrorExit<std::__cxx11::string_const&>
            ((FileLoc *)values,(char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)
             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
}

Assistant:

typename ParameterTypeTraits<PT>::ReturnType ParameterDictionary::lookupSingle(
    const std::string &name,
    typename ParameterTypeTraits<PT>::ReturnType defaultValue) const {
    // Search _params_ for parameter _name_
    using traits = ParameterTypeTraits<PT>;
    for (const ParsedParameter *p : params) {
        if (p->name != name || p->type != traits::typeName)
            continue;
        // Extract parameter values from _p_
        const auto &values = traits::GetValues(*p);

        // Issue error if incorrect number of parameter values were provided
        if (values.empty())
            ErrorExit(&p->loc, "No values provided for parameter \"%s\".", name);
        if (values.size() > traits::nPerItem)
            ErrorExit(&p->loc, "More than one value provided for parameter \"%s\".",
                      name);

        // Return parameter values as _ReturnType_
        p->lookedUp = true;
        return traits::Convert(values.data(), &p->loc);
    }

    return defaultValue;
}